

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O2

void __thiscall
agge::tests::VectorRasterizerTests::InPixelRectsAreProperlyRasterizedToCells
          (VectorRasterizerTests *this)

{
  cell reference2 [1];
  cell reference1 [1];
  vector_rasterizer vr;
  allocator local_e9;
  cell local_e8;
  cell local_d8;
  string local_c8;
  LocationInfo local_a8;
  vector_rasterizer local_80;
  
  vector_rasterizer::vector_rasterizer(&local_80);
  vector_rasterizer::line(&local_80,0xf1a,0xa1a,0xf66,0xa1a);
  vector_rasterizer::line(&local_80,0xf66,0xa1a,0xf66,0xab3);
  vector_rasterizer::line(&local_80,0xf66,0xab3,0xf1a,0xab3);
  vector_rasterizer::line(&local_80,0xf1a,0xab3,0xf1a,0xa1a);
  local_d8.x = 0xf;
  local_d8.y = 10;
  local_d8.area = 0x5ad8;
  local_d8.cover = 0;
  std::__cxx11::string::string
            ((string *)&local_c8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,(allocator *)&local_e8);
  ut::LocationInfo::LocationInfo(&local_a8,&local_c8,0x208);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])&local_d8,&local_80._cells,&local_a8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::reset(&local_80);
  vector_rasterizer::line(&local_80,0x1126,0x651a,0x1126,0x659a);
  vector_rasterizer::line(&local_80,0x1126,0x659a,0x11e4,0x659a);
  vector_rasterizer::line(&local_80,0x11e4,0x659a,0x11e4,0x651a);
  vector_rasterizer::line(&local_80,0x11e4,0x651a,0x1126,0x651a);
  local_e8.x = 0x11;
  local_e8.y = 0x65;
  local_e8.area = -0xbe00;
  local_e8.cover = 0;
  std::__cxx11::string::string
            ((string *)&local_c8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_e9);
  ut::LocationInfo::LocationInfo(&local_a8,&local_c8,0x218);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,1ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [1])&local_e8,&local_80._cells,&local_a8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::~vector_rasterizer(&local_80);
  return;
}

Assistant:

test( InPixelRectsAreProperlyRasterizedToCells )
			{
				// INIT
				vector_rasterizer vr;

				// ACT (76 x 153)
				vr.line(fp(15.1), fp(10.1), fp(15.4), fp(10.1));
				vr.line(fp(15.4), fp(10.1), fp(15.4), fp(10.7));
				vr.line(fp(15.4), fp(10.7), fp(15.1), fp(10.7));
				vr.line(fp(15.1), fp(10.7), fp(15.1), fp(10.1));

				// ASSERT
				const vector_rasterizer::cell reference1[] = {
					{ 15, 10, 2 * 11628, 0 },
				};

				assert_equal(reference1, vr.cells());

				// INIT
				vr.reset();

				// ACT (190 x 128)
				vr.line(fp(17.15), fp(101.1), fp(17.15), fp(101.6));
				vr.line(fp(17.15), fp(101.6), fp(17.89), fp(101.6));
				vr.line(fp(17.89), fp(101.6), fp(17.89), fp(101.1));
				vr.line(fp(17.89), fp(101.1), fp(17.15), fp(101.1));

				// ASSERT
				const vector_rasterizer::cell reference2[] = {
					{ 17, 101, -2 * 24320, 0 },
				};

				assert_equal(reference2, vr.cells());
			}